

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_script.cpp
# Opt level: O0

void __thiscall Script_GetHex_Test::~Script_GetHex_Test(Script_GetHex_Test *this)

{
  Script_GetHex_Test *this_local;
  
  ~Script_GetHex_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Script, GetHex) {
  Script script(
      "002096376230fbeec4d1e703c3a2d1efe975ccf650a40f6ca2ec2d6cce44fc6bb2b3");
  std::string hex = script.GetHex();
  EXPECT_STREQ(
      hex.c_str(),
      "002096376230fbeec4d1e703c3a2d1efe975ccf650a40f6ca2ec2d6cce44fc6bb2b3");
}